

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall SignalSwitcher::SignalSwitcher(SignalSwitcher *this)

{
  __sighandler_t p_Var1;
  bool bVar2;
  
  bVar2 = !handle_is_locked;
  if (bVar2) {
    handle_is_locked = true;
    interrupt_switch = false;
    p_Var1 = signal(2,set_interrup_global_variable);
    this->old_sig = (sig_t_)p_Var1;
  }
  this->is_active = bVar2;
  return;
}

Assistant:

SignalSwitcher::SignalSwitcher()
{
    #pragma omp critical
    {
        if (!handle_is_locked)
        {
            handle_is_locked = true;
            interrupt_switch = false;
            this->old_sig = signal(SIGINT, set_interrup_global_variable);
            this->is_active = true;
        }

        else {
            this->is_active = false;
        }
    }
}